

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

wstring * __thiscall
booster::locale::impl_posix::ftime_traits<wchar_t>::ftime_abi_cxx11_
          (wstring *__return_storage_ptr__,ftime_traits<wchar_t> *this,wchar_t *format,tm *t,
          locale_t lc)

{
  char *pcVar1;
  string nformat;
  string nres;
  string enc;
  
  pcVar1 = nl_langinfo_l(0xe,(__locale_t)t);
  std::__cxx11::string::string((string *)&enc,pcVar1,(allocator *)&nformat);
  conv::from_utf<wchar_t>(&nformat,(wchar_t *)this,&enc,default_method);
  ftime_traits<char>::ftime_abi_cxx11_
            (&nres,(ftime_traits<char> *)nformat._M_dataplus._M_p,(char *)format,t,lc);
  conv::to_utf<wchar_t>(__return_storage_ptr__,&nres,&enc,default_method);
  std::__cxx11::string::~string((string *)&nres);
  std::__cxx11::string::~string((string *)&nformat);
  std::__cxx11::string::~string((string *)&enc);
  return __return_storage_ptr__;
}

Assistant:

static std::wstring ftime(wchar_t const *format,const struct tm *t,locale_t lc)
    {
        #ifdef HAVE_WCSFTIME_L
            wchar_t buf[16];
            size_t n=wcsftime_l(buf,sizeof(buf)/sizeof(buf[0]),format,t,lc);
            if(n == 0) {
                // should be big enough
                //
                // Note standard specifies that in case of the error
                // the function returns 0, however 0 may be actually
                // valid output value of for example empty format or an
                // output of %p in some locales
                //
                // Thus we try to guess that 1024 would be enough.
                std::vector<wchar_t> v(1024);
                n = wcsftime_l(&v.front(),1024,format,t,lc);
            }
            return std::wstring(&v.front(),n);
        #else
            std::string enc = nl_langinfo_l(CODESET,lc);
            std::string nformat = conv::from_utf<wchar_t>(format,enc);
            std::string nres = ftime_traits<char>::ftime(nformat.c_str(),t,lc);
            return conv::to_utf<wchar_t>(nres,enc);
        #endif
    }